

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

ExprBase * anon_unknown.dwarf_baae3::Report(InstructionVMEvalContext *ctx,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list args;
  char *msg_local;
  InstructionVMEvalContext *ctx_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((ctx->hasError & 1U) == 0) {
    if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
      args[0].overflow_arg_area = local_e8;
      args[0]._0_8_ = &stack0x00000008;
      local_34 = 0x30;
      local_38 = 0x10;
      local_d8 = in_RDX;
      local_d0 = in_RCX;
      local_c8 = in_R8;
      local_c0 = in_R9;
      args[0].reg_save_area = msg;
      vsnprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,msg,&local_38);
      ctx->errorBuf[ctx->errorBufSize - 1] = '\0';
    }
    ctx->hasError = true;
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* Report(InstructionVMEvalContext &ctx, const char *msg, ...)
	{
		// Do not replace previous error
		if(ctx.hasError)
			return NULL;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			va_list args;
			va_start(args, msg);

			vsnprintf(ctx.errorBuf, ctx.errorBufSize, msg, args);

			va_end(args);

			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';
		}

		ctx.hasError = true;

		return NULL;
	}